

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugNodeColumns(ImGuiOldColumns *columns)

{
  float offset_norm;
  ImGuiOldColumnData *pIVar1;
  ImGuiOldColumnData *pIVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  float fVar6;
  
  bVar3 = TreeNode((void *)(ulong)columns->ID,"Columns Id: 0x%08X, Count: %d, Flags: 0x%04X",
                   (void *)(ulong)columns->ID,(ulong)(uint)columns->Count,
                   (ulong)(uint)columns->Flags);
  if (bVar3) {
    BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)",(double)(columns->OffMaxX - columns->OffMinX),
               (double)columns->OffMinX,(double)columns->OffMaxX);
    lVar4 = (long)(columns->Columns).Size;
    if (lVar4 != 0) {
      pIVar1 = (columns->Columns).Data;
      lVar5 = 0;
      do {
        pIVar2 = (columns->Columns).Data;
        offset_norm = *(float *)((long)&pIVar1->OffsetNorm + lVar5);
        fVar6 = GetColumnOffsetFromNorm(columns,offset_norm);
        BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)",(double)offset_norm,(double)fVar6,
                   (ulong)(uint)((int)((ulong)((long)pIVar1 + (lVar5 - (long)pIVar2)) >> 2) *
                                -0x49249249));
        lVar5 = lVar5 + 0x1c;
      } while (lVar4 * 0x1c != lVar5);
    }
    TreePop();
    return;
  }
  return;
}

Assistant:

void ImGui::DebugNodeColumns(ImGuiOldColumns* columns)
{
    if (!TreeNode((void*)(uintptr_t)columns->ID, "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X", columns->ID, columns->Count, columns->Flags))
        return;
    BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)", columns->OffMaxX - columns->OffMinX, columns->OffMinX, columns->OffMaxX);
    for (ImGuiOldColumnData& column : columns->Columns)
        BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)", (int)columns->Columns.index_from_ptr(&column), column.OffsetNorm, GetColumnOffsetFromNorm(columns, column.OffsetNorm));
    TreePop();
}